

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O2

FT_Error FT_Outline_Render(FT_Library library,FT_Outline *outline,FT_Raster_Params *params)

{
  int iVar1;
  FT_Renderer_conflict pFVar2;
  FT_ListNode node;
  
  if (library == (FT_Library)0x0) {
    iVar1 = 0x21;
  }
  else if (outline == (FT_Outline *)0x0) {
    iVar1 = 0x14;
  }
  else if (params == (FT_Raster_Params *)0x0) {
    iVar1 = 6;
  }
  else {
    node = (library->renderers).head;
    pFVar2 = library->cur_renderer;
    params->source = outline;
    iVar1 = 0x13;
    while (pFVar2 != (FT_Renderer_conflict)0x0) {
      iVar1 = (*pFVar2->raster_render)(pFVar2->raster,params);
      if (iVar1 == 0) {
        return 0;
      }
      if ((char)iVar1 != '\x13') {
        return iVar1;
      }
      pFVar2 = FT_Lookup_Renderer(library,FT_GLYPH_FORMAT_OUTLINE,&node);
    }
  }
  return iVar1;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Outline_Render( FT_Library         library,
                     FT_Outline*        outline,
                     FT_Raster_Params*  params )
  {
    FT_Error     error;
    FT_Renderer  renderer;
    FT_ListNode  node;


    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !outline )
      return FT_THROW( Invalid_Outline );

    if ( !params )
      return FT_THROW( Invalid_Argument );

    renderer = library->cur_renderer;
    node     = library->renderers.head;

    params->source = (void*)outline;

    error = FT_ERR( Cannot_Render_Glyph );
    while ( renderer )
    {
      error = renderer->raster_render( renderer->raster, params );
      if ( !error || FT_ERR_NEQ( error, Cannot_Render_Glyph ) )
        break;

      /* FT_Err_Cannot_Render_Glyph is returned if the render mode   */
      /* is unsupported by the current renderer for this glyph image */
      /* format                                                      */

      /* now, look for another renderer that supports the same */
      /* format                                                */
      renderer = FT_Lookup_Renderer( library, FT_GLYPH_FORMAT_OUTLINE,
                                     &node );
    }

    return error;
  }